

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

NumberParsingStatus __thiscall
QTextStreamPrivate::getNumber(QTextStreamPrivate *this,qulonglong *ret)

{
  QLocale *this_00;
  char16_t cVar1;
  bool bVar2;
  char32_t cVar3;
  int iVar4;
  uint uVar5;
  QChar QVar6;
  NumberParsingStatus NVar7;
  QChar *ch;
  qulonglong qVar8;
  long lVar9;
  long in_FS_OFFSET;
  qulonglong local_90;
  long local_88;
  QChar local_72;
  QChar local_70;
  char16_t *local_68;
  long local_60;
  QChar local_58;
  char16_t *local_50;
  long local_48;
  QChar local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  scan(this,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
  consumeLastToken(this);
  iVar4 = (this->params).integerBase;
  if (iVar4 == 0) {
    local_3a.ucs = L'\0';
    bVar2 = getChar(this,&local_3a);
    NVar7 = npsInvalidPrefix;
    if (!bVar2) goto switchD_002cca1a_caseD_1;
    if (local_3a.ucs == L'0') {
      local_58.ucs = L'\0';
      bVar2 = getChar(this,&local_58);
      if (!bVar2) {
        *ret = 0;
        NVar7 = npsOk;
        goto switchD_002cca1a_caseD_1;
      }
      cVar3 = QChar::toLower((uint)(ushort)local_58.ucs);
      QVar6.ucs = (char16_t)cVar3;
      local_58.ucs = QVar6.ucs;
      if (QVar6.ucs == L'b') {
        iVar4 = 2;
      }
      else if ((cVar3 & 0xffffU) == 0x78) {
        iVar4 = 0x10;
      }
      else {
        bVar2 = QChar::isDigit(cVar3 & 0xffffU);
        if ((bVar2) && (uVar5 = QChar::digitValue(cVar3 & 0xffffU), uVar5 < 8)) {
          iVar4 = 8;
        }
        else {
          iVar4 = 10;
        }
      }
      ungetChar(this,QVar6);
    }
    else {
      iVar4 = 10;
      QLocale::negativeSign((QString *)&local_58,&this->locale);
      if ((local_48 != 1) || (*local_50 != local_3a.ucs)) {
        QLocale::positiveSign((QString *)&local_70,&this->locale);
        if ((local_60 != 1) || (*local_68 != local_3a.ucs)) {
          bVar2 = QChar::isDigit((uint)(ushort)local_3a.ucs);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          if (!bVar2) {
            ungetChar(this,local_3a);
            goto switchD_002cca1a_caseD_1;
          }
          goto LAB_002ccfb1;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
LAB_002ccfb1:
    ungetChar(this,local_3a);
  }
  NVar7 = npsInvalidPrefix;
  switch(iVar4 - 2U >> 1 | (uint)((iVar4 - 2U & 1) != 0) << 0x1f) {
  case 0:
    local_58.ucs = L'\0';
    local_70.ucs = L'\0';
    local_3a.ucs = L'\0';
    bVar2 = getChar(this,&local_58);
    NVar7 = npsInvalidPrefix;
    if ((((!bVar2) || (local_58.ucs != L'0')) || (bVar2 = getChar(this,&local_70), !bVar2)) ||
       (cVar3 = QChar::toLower((uint)(ushort)local_70.ucs), (short)cVar3 != 0x62))
    goto switchD_002cca1a_caseD_1;
    lVar9 = 0;
    qVar8 = 0;
    while (bVar2 = getChar(this,&local_3a), QVar6.ucs = local_3a.ucs, bVar2) {
      cVar3 = QChar::toLower((uint)(ushort)local_3a.ucs);
      if (((ushort)cVar3 & 0xfffe) != 0x30) {
        ungetChar(this,QVar6);
        break;
      }
      qVar8 = (ulong)(uint)(cVar3 & 1) + qVar8 * 2;
      lVar9 = lVar9 + -1;
    }
    if (lVar9 == 0) {
      ungetChar(this,local_70);
LAB_002ccdda:
      ungetChar(this,local_58);
LAB_002ccf72:
      NVar7 = npsMissingDigit;
      goto switchD_002cca1a_caseD_1;
    }
    break;
  default:
    goto switchD_002cca1a_caseD_1;
  case 3:
    local_58.ucs = L'\0';
    local_70.ucs = L'\0';
    bVar2 = getChar(this,&local_58);
    NVar7 = npsInvalidPrefix;
    if ((!bVar2) || (local_58.ucs != L'0')) goto switchD_002cca1a_caseD_1;
    lVar9 = 0;
    qVar8 = 0;
    while (bVar2 = getChar(this,&local_70), QVar6.ucs = local_70.ucs, bVar2) {
      cVar3 = QChar::toLower((uint)(ushort)local_70.ucs);
      if ((cVar3 & 0xfff8U) != 0x30) {
        ungetChar(this,QVar6);
        break;
      }
      qVar8 = (ulong)(uint)((cVar3 & 0x37U) - 0x30) + qVar8 * 8;
      lVar9 = lVar9 + -1;
    }
    if (lVar9 == 0) goto LAB_002ccdda;
    break;
  case 4:
    local_3a.ucs = L'\0';
    bVar2 = getChar(this,&local_3a);
    if (!bVar2) {
LAB_002ccee5:
      NVar7 = npsMissingDigit;
      goto switchD_002cca1a_caseD_1;
    }
    this_00 = &this->locale;
    QLocale::negativeSign((QString *)&local_58,this_00);
    if ((local_48 == 1) && (*local_50 == local_3a.ucs)) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
LAB_002ccd6f:
      local_90 = 0;
      local_88 = 0;
    }
    else {
      QLocale::positiveSign((QString *)&local_70,this_00);
      QVar6.ucs = local_3a.ucs;
      if (local_60 == 1) {
        cVar1 = *local_68;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        if (cVar1 == QVar6.ucs) goto LAB_002ccd6f;
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
      QVar6.ucs = local_3a.ucs;
      bVar2 = QChar::isDigit((uint)(ushort)local_3a.ucs);
      if (!bVar2) {
        ungetChar(this,QVar6);
        goto LAB_002ccee5;
      }
      iVar4 = QChar::digitValue((uint)(ushort)QVar6.ucs);
      local_90 = (qulonglong)iVar4;
      local_88 = 1;
    }
    local_72.ucs = L'\0';
    do {
      while( true ) {
        ch = &local_72;
        bVar2 = getChar(this,ch);
        if (!bVar2) goto LAB_002ccf41;
        cVar3 = (char32_t)(ushort)local_72.ucs;
        bVar2 = QChar::isDigit(cVar3);
        if (!bVar2) break;
        iVar4 = QChar::digitValue(cVar3);
        local_90 = (long)iVar4 + local_90 * 10;
        local_88 = local_88 + 1;
      }
      QLocale::c((QLocale *)&local_70,ch);
      bVar2 = ::operator!=(this_00,(QLocale *)&local_70);
      if (!bVar2) {
LAB_002ccf2a:
        QLocale::~QLocale((QLocale *)&local_70);
        break;
      }
      QLocale::groupSeparator((QString *)&local_58,this_00);
      QVar6.ucs = local_72.ucs;
      if (local_48 != 1) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        goto LAB_002ccf2a;
      }
      cVar1 = *local_50;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QLocale::~QLocale((QLocale *)&local_70);
    } while (cVar1 == QVar6.ucs);
    ungetChar(this,local_72);
LAB_002ccf41:
    if (local_88 == 0) goto LAB_002ccf72;
    QLocale::negativeSign((QString *)&local_58,this_00);
    if (local_48 == 1) {
      bVar2 = *local_50 == local_3a.ucs;
    }
    else {
      bVar2 = false;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    qVar8 = -local_90;
    if ((long)local_90 < 1) {
      qVar8 = local_90;
    }
    if (!bVar2) {
      qVar8 = local_90;
    }
    break;
  case 7:
    local_58.ucs = L'\0';
    local_70.ucs = L'\0';
    local_3a.ucs = L'\0';
    bVar2 = getChar(this,&local_58);
    if ((((!bVar2) || (local_58.ucs != L'0')) || (bVar2 = getChar(this,&local_70), !bVar2)) ||
       (cVar3 = QChar::toLower((uint)(ushort)local_70.ucs), (short)cVar3 != 0x78))
    goto switchD_002cca1a_caseD_1;
    lVar9 = 0;
    qVar8 = 0;
    while (bVar2 = getChar(this,&local_3a), bVar2) {
      iVar4 = QtMiscUtils::fromHex((uint)(ushort)local_3a.ucs);
      if (iVar4 == -1) {
        ungetChar(this,local_3a);
        break;
      }
      qVar8 = qVar8 * 0x10 + (long)iVar4;
      lVar9 = lVar9 + -1;
    }
    NVar7 = npsMissingDigit;
    if (lVar9 == 0) goto switchD_002cca1a_caseD_1;
  }
  NVar7 = npsOk;
  if (ret != (qulonglong *)0x0) {
    *ret = qVar8;
  }
switchD_002cca1a_caseD_1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return NVar7;
  }
  __stack_chk_fail();
}

Assistant:

QTextStreamPrivate::NumberParsingStatus QTextStreamPrivate::getNumber(qulonglong *ret)
{
    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    // detect integer encoding
    int base = params.integerBase;
    if (base == 0) {
        QChar ch;
        if (!getChar(&ch))
            return npsInvalidPrefix;
        if (ch == u'0') {
            QChar ch2;
            if (!getChar(&ch2)) {
                // Result is the number 0
                *ret = 0;
                return npsOk;
            }
            ch2 = ch2.toLower();

            if (ch2 == u'x') {
                base = 16;
            } else if (ch2 == u'b') {
                base = 2;
            } else if (ch2.isDigit() && ch2.digitValue() >= 0 && ch2.digitValue() <= 7) {
                base = 8;
            } else {
                base = 10;
            }
            ungetChar(ch2);
        } else if (ch == locale.negativeSign() || ch == locale.positiveSign() || ch.isDigit()) {
            base = 10;
        } else {
            ungetChar(ch);
            return npsInvalidPrefix;
        }
        ungetChar(ch);
        // State of the stream is now the same as on entry
        // (cursor is at prefix),
        // and local variable 'base' has been set appropriately.
    }

    qulonglong val=0;
    switch (base) {
    case 2: {
        QChar pf1, pf2, dig;
        // Parse prefix '0b'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'b')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (n == u'0' || n == u'1') {
                val <<= 1;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf2);
            ungetChar(pf1);
            return npsMissingDigit;
        }
        break;
    }
    case 8: {
        QChar pf, dig;
        // Parse prefix u'0'
        if (!getChar(&pf) || pf != u'0')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (isOctalDigit(n)) {
                val *= 8;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf);
            return npsMissingDigit;
        }
        break;
    }
    case 10: {
        // Parse sign (or first digit)
        QChar sign;
        qsizetype ndigits = 0;
        if (!getChar(&sign))
            return npsMissingDigit;
        if (sign != locale.negativeSign() && sign != locale.positiveSign()) {
            if (!sign.isDigit()) {
                ungetChar(sign);
                return npsMissingDigit;
            }
            val += sign.digitValue();
            ndigits++;
        }
        // Parse digits
        QChar ch;
        while (getChar(&ch)) {
            if (ch.isDigit()) {
                val *= 10;
                val += ch.digitValue();
            } else if (locale != QLocale::c() && ch == locale.groupSeparator()) {
                continue;
            } else {
                ungetChar(ch);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0)
            return npsMissingDigit;
        if (sign == locale.negativeSign()) {
            qlonglong ival = qlonglong(val);
            if (ival > 0)
                ival = -ival;
            val = qulonglong(ival);
        }
        break;
    }
    case 16: {
        QChar pf1, pf2, dig;
        // Parse prefix ' 0x'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'x')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            const int h = fromHex(dig.unicode());
            if (h != -1) {
                val <<= 4;
                val += h;
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            return npsMissingDigit;
        }
        break;
    }
    default:
        // Unsupported integerBase
        return npsInvalidPrefix;
    }

    if (ret)
        *ret = val;
    return npsOk;
}